

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void __thiscall
Diligent::LogicOperationToVkLogicOp::LogicOperationToVkLogicOp(LogicOperationToVkLogicOp *this)

{
  reference pvVar1;
  LogicOperationToVkLogicOp *this_local;
  
  memset(this,0,0x40);
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0);
  *pvVar1 = VK_LOGIC_OP_CLEAR;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,1);
  *pvVar1 = VK_LOGIC_OP_SET;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,2);
  *pvVar1 = VK_LOGIC_OP_COPY;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,3);
  *pvVar1 = VK_LOGIC_OP_COPY_INVERTED;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,4);
  *pvVar1 = VK_LOGIC_OP_NO_OP;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,5);
  *pvVar1 = VK_LOGIC_OP_INVERT;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,6);
  *pvVar1 = VK_LOGIC_OP_AND;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,7);
  *pvVar1 = VK_LOGIC_OP_NAND;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,8);
  *pvVar1 = VK_LOGIC_OP_OR;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,9);
  *pvVar1 = VK_LOGIC_OP_NOR;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,10);
  *pvVar1 = VK_LOGIC_OP_XOR;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0xb);
  *pvVar1 = VK_LOGIC_OP_EQUIVALENT;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0xc);
  *pvVar1 = VK_LOGIC_OP_AND_REVERSE;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0xd);
  *pvVar1 = VK_LOGIC_OP_AND_INVERTED;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0xe);
  *pvVar1 = VK_LOGIC_OP_OR_REVERSE;
  pvVar1 = std::array<VkLogicOp,_16UL>::operator[](&this->m_Map,0xf);
  *pvVar1 = VK_LOGIC_OP_OR_INVERTED;
  return;
}

Assistant:

LogicOperationToVkLogicOp()
    {
        m_Map[LOGIC_OP_CLEAR]         = VK_LOGIC_OP_CLEAR;
        m_Map[LOGIC_OP_SET]           = VK_LOGIC_OP_SET;
        m_Map[LOGIC_OP_COPY]          = VK_LOGIC_OP_COPY;
        m_Map[LOGIC_OP_COPY_INVERTED] = VK_LOGIC_OP_COPY_INVERTED;
        m_Map[LOGIC_OP_NOOP]          = VK_LOGIC_OP_NO_OP;
        m_Map[LOGIC_OP_INVERT]        = VK_LOGIC_OP_INVERT;
        m_Map[LOGIC_OP_AND]           = VK_LOGIC_OP_AND;
        m_Map[LOGIC_OP_NAND]          = VK_LOGIC_OP_NAND;
        m_Map[LOGIC_OP_OR]            = VK_LOGIC_OP_OR;
        m_Map[LOGIC_OP_NOR]           = VK_LOGIC_OP_NOR;
        m_Map[LOGIC_OP_XOR]           = VK_LOGIC_OP_XOR;
        m_Map[LOGIC_OP_EQUIV]         = VK_LOGIC_OP_EQUIVALENT;
        m_Map[LOGIC_OP_AND_REVERSE]   = VK_LOGIC_OP_AND_REVERSE;
        m_Map[LOGIC_OP_AND_INVERTED]  = VK_LOGIC_OP_AND_INVERTED;
        m_Map[LOGIC_OP_OR_REVERSE]    = VK_LOGIC_OP_OR_REVERSE;
        m_Map[LOGIC_OP_OR_INVERTED]   = VK_LOGIC_OP_OR_INVERTED;
    }